

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O2

void __thiscall string_view_cbegin_cend_Test::TestBody(string_view_cbegin_cend_Test *this)

{
  long lVar1;
  char *pcVar2;
  char count;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  count = '\0';
  lVar1 = 0;
  do {
    if (lVar1 == 6) {
      local_50.ptr_._0_4_ = 6;
      testing::internal::CmpHelperEQ<int,char>
                ((internal *)&gtest_ar,"6","count",(int *)&local_50,&count);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                   ,0x61,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
LAB_00206cbf:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_50);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    local_50.ptr_._0_4_ = (int)lVar1 + 0x30;
    testing::internal::CmpHelperEQ<int,char>
              ((internal *)&gtest_ar,"\'0\' + count","*iter",(int *)&local_50,"012345" + lVar1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      goto LAB_00206cbf;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar1 = lVar1 + 1;
    count = (char)lVar1;
  } while( true );
}

Assistant:

TEST(string_view, cbegin_cend) {
  const string_view sv("012345");

  char count = 0;
  for (auto iter = sv.cbegin(), end = sv.cend(); iter != end; ++iter) {
    ASSERT_EQ('0' + count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}